

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O3

BOOL __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::IsFreeObject
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,void *objectAddress)

{
  char *pcVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  ushort uVar5;
  undefined4 *puVar6;
  uint uVar7;
  
  pcVar1 = (this->super_HeapBlock).address;
  uVar7 = 0;
  if (objectAddress < pcVar1 + 0x8000 && pcVar1 <= objectAddress) {
    uVar5 = GetAddressIndex(this,objectAddress);
    uVar7 = 0;
    if (uVar5 != 0xffff) {
      if (((ulong)objectAddress & 0xf) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                           ,0x24d,"(HeapInfo::IsAlignedAddress(objectAddress))",
                           "HeapInfo::IsAlignedAddress(objectAddress)");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
      bVar4 = BVStatic<2048UL>::Test(&this->debugFreeBits,(uint)((ulong)objectAddress >> 4) & 0x7ff)
      ;
      uVar7 = (uint)bVar4;
    }
  }
  return uVar7;
}

Assistant:

BOOL
SmallHeapBlockT<TBlockAttributes>::IsFreeObject(void * objectAddress)
{
    if (objectAddress < this->GetAddress() || objectAddress >= this->GetEndAddress())
    {
        return false;
    }
    ushort index = GetAddressIndex(objectAddress);
    if (index == SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit)
    {
        return false;
    }

    return this->GetDebugFreeBitVector()->Test(GetAddressBitIndex(objectAddress));
}